

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O0

QList<QSize> * __thiscall QOpenGLFramebufferObject::sizes(QOpenGLFramebufferObject *this)

{
  QOpenGLFramebufferObjectPrivate *pQVar1;
  const_iterator pCVar2;
  QList<QSize> *in_RDI;
  ColorAttachment *color;
  const_iterator __end1;
  const_iterator __begin1;
  QVarLengthArray<QOpenGLFramebufferObjectPrivate::ColorAttachment,_8LL> *__range1;
  QOpenGLFramebufferObjectPrivate *d;
  QList<QSize> *sz;
  parameter_type in_stack_ffffffffffffffa8;
  QList<QSize> *this_00;
  const_iterator local_30;
  QList<QSize> *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  pQVar1 = d_func((QOpenGLFramebufferObject *)0x14af09);
  ((QVLABaseBase *)&in_RDI->d)->a = -0x5555555555555556;
  ((QVLABaseBase *)&in_RDI->d)->s = -0x5555555555555556;
  ((QVLABaseBase *)&in_RDI->d)->ptr = (void *)0xaaaaaaaaaaaaaaaa;
  QList<QSize>::QList((QList<QSize> *)0x14af3d);
  QVLABaseBase::size((QVLABaseBase *)&pQVar1->colorAttachments);
  QList<QSize>::reserve(in_stack_ffffffffffffffd8,(qsizetype)color);
  local_30 = QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>::begin
                       ((QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *)0x14af7f);
  pCVar2 = QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>::end
                     ((QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *)this_00);
  for (; local_30 != pCVar2; local_30 = local_30 + 1) {
    QList<QSize>::append(this_00,in_stack_ffffffffffffffa8);
  }
  return this_00;
}

Assistant:

QList<QSize> QOpenGLFramebufferObject::sizes() const
{
    Q_D(const QOpenGLFramebufferObject);
    QList<QSize> sz;
    sz.reserve(d->colorAttachments.size());
    for (const auto &color : d->colorAttachments)
        sz.append(color.size);
    return sz;
}